

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> __thiscall
enact::Parser::expectTypenamePrecFunction(Parser *this,string *msg,bool emptyAllowed)

{
  pointer *ppuVar1;
  pointer puVar2;
  long *plVar3;
  int iVar4;
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  *pvVar5;
  FunctionTypename *this_00;
  pointer *__ptr;
  pointer puVar6;
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> returnTypename;
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  parameterTypenames;
  size_type __dnew;
  undefined1 local_a8 [16];
  undefined1 local_98 [32];
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  local_78;
  undefined1 local_50 [8];
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  local_48;
  
  expectTypenamePrecUnary(this,msg,emptyAllowed);
  if (*(int *)&msg[7]._M_dataplus._M_p == 0x18) {
    advance((Parser *)msg);
    local_98._0_8_ = (pointer)0x0;
    local_98._8_8_ = 0;
    local_98._16_8_ = 0;
    iVar4 = (**(code **)((this->m_context->m_source)._M_dataplus._M_p + 0x18))();
    if (iVar4 == 3) {
      local_50 = (undefined1  [8])this->m_context;
      this->m_context = (CompileContext *)0x0;
      local_a8._8_8_ = this;
      pvVar5 = TupleTypename::elementTypenames((TupleTypename *)local_50);
      local_48.
      super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.
      super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.
      super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      puVar6 = (pvVar5->
               super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      puVar2 = (pvVar5->
               super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (puVar6 != puVar2) {
        do {
          (*((puVar6->_M_t).
             super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>
             .super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl)->_vptr_Typename[2]
          )(local_a8);
          local_78.
          super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_a8._0_8_;
          local_a8._0_8_ = (CompileContext *)0x0;
          std::
          vector<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::allocator<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>>
          ::
          emplace_back<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>
                    ((vector<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::allocator<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>>
                      *)&local_48,
                     (unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
                      *)&local_78);
          if ((CompileContext *)
              local_78.
              super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (CompileContext *)0x0) {
            (**(code **)((((string *)
                          &(local_78.
                            super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_t)->_M_dataplus)._M_p + 8
                        ))();
          }
          local_78.
          super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          if ((CompileContext *)local_a8._0_8_ != (CompileContext *)0x0) {
            (**(code **)((((string *)local_a8._0_8_)->_M_dataplus)._M_p + 8))();
          }
          puVar6 = puVar6 + 1;
        } while (puVar6 != puVar2);
      }
      local_78.
      super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_98._16_8_;
      local_78.
      super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_98._8_8_;
      local_78.
      super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_98._0_8_;
      local_98._0_8_ =
           local_48.
           super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_98._8_8_ =
           local_48.
           super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_98._16_8_ =
           local_48.
           super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_48.
      super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.
      super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.
      super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
      ::~vector(&local_78);
      std::
      vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
      ::~vector(&local_48);
      (**(code **)(*(long *)local_50 + 8))();
      this = (Parser *)local_a8._8_8_;
    }
    else {
      std::
      vector<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::allocator<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>>
      ::
      emplace_back<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>
                ((vector<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::allocator<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>>
                  *)local_98,
                 (unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *)
                 this);
    }
    ppuVar1 = &local_78.
               super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48.
    super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x24;
    local_78.
    super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar1;
    local_78.
    super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_78,(ulong)&local_48);
    local_78.
    super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_48.
         super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_78.
    super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[2]._M_t.
    super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>._M_t.
    super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>.
    super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl =
         (Typename *)0x656d616e65707974;
    local_78.
    super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[3]._M_t.
    super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>._M_t.
    super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>.
    super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl =
         (Typename *)0x2720726574666120;
    ((local_78.
      super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->_M_t).
    super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>._M_t.
    super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>.
    super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl =
         (Typename *)0x6465746365707845;
    local_78.
    super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
    super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>._M_t.
    super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>.
    super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl =
         (Typename *)0x206e727574657220;
    *(undefined4 *)
     &local_78.
      super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[4]._M_t.
      super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>._M_t
      .super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>.
      super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl = 0x2e273e3d;
    local_78.
    super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_48.
         super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(undefined1 *)
     ((long)&((local_78.
               super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>
             .super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl +
     (long)local_48.
           super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start) = 0;
    expectTypenamePrecFunction((Parser *)local_a8,msg,SUB81(&local_78,0));
    if (local_78.
        super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppuVar1) {
      operator_delete(local_78.
                      super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((local_78.
                                       super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_t).
                                     super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>
                                     .super__Head_base<0UL,_const_enact::Typename_*,_false>.
                                     _M_head_impl + 1));
    }
    this_00 = (FunctionTypename *)operator_new(0x48);
    local_48.
    super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_a8._0_8_;
    local_a8._0_8_ = (CompileContext *)0x0;
    local_78.
    super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_98._0_8_;
    local_78.
    super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_98._8_8_;
    local_78.
    super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_98._16_8_;
    local_98._0_8_ = (pointer)0x0;
    local_98._8_8_ = 0;
    local_98._16_8_ = 0;
    FunctionTypename::FunctionTypename
              (this_00,(unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
                        *)&local_48,&local_78);
    std::
    vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ::~vector(&local_78);
    if ((CompileContext *)
        local_48.
        super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (CompileContext *)0x0) {
      (**(code **)(*(long *)local_48.
                            super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 8))();
    }
    plVar3 = *(long **)this;
    *(FunctionTypename **)this = this_00;
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 8))();
    }
    if ((CompileContext *)local_a8._0_8_ != (CompileContext *)0x0) {
      (**(code **)((((string *)local_a8._0_8_)->_M_dataplus)._M_p + 8))();
    }
    std::
    vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ::~vector((vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
               *)local_98);
  }
  return (__uniq_ptr_data<const_enact::Typename,_std::default_delete<const_enact::Typename>,_true,_true>
          )(tuple<const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>)this;
}

Assistant:

std::unique_ptr<const Typename> Parser::expectTypenamePrecFunction(const std::string& msg, bool emptyAllowed) {
        std::unique_ptr<const Typename> typename_ = expectTypenamePrecUnary(msg, emptyAllowed);

        if (consume(TokenType::EQUAL_GREATER)) {
            std::vector<std::unique_ptr<const Typename>> parameterTypenames;
            if (typename_->kind() == Typename::Kind::TUPLE) {
                parameterTypenames = cloneAll(
                        static_unique_ptr_cast<const TupleTypename>(
                                std::move(typename_))
                                ->elementTypenames());
            } else {
                parameterTypenames.push_back(std::move(typename_));
            }

            std::unique_ptr<const Typename> returnTypename =
                    expectTypename("Expected return typename after '=>'.");

            typename_ = std::make_unique<FunctionTypename>(std::move(returnTypename), std::move(parameterTypenames));
        }

        return typename_;
    }